

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

bool __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::SizeAtCapacity(RepeatedPtrFieldBase *this)

{
  int v2;
  int iVar1;
  Nonnull<const_char_*> failure_msg;
  LogMessageFatal local_20;
  
  iVar1 = this->current_size_;
  v2 = allocated_size(this);
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                          (iVar1,v2,"size() <= allocated_size()");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    iVar1 = allocated_size(this);
    failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                            (iVar1,this->capacity_proxy_ + 1,"allocated_size() <= Capacity()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      return this->capacity_proxy_ < this->current_size_;
    }
    iVar1 = 0x282;
  }
  else {
    iVar1 = 0x281;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,iVar1,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline bool SizeAtCapacity() const {
    // Harden invariant size() <= allocated_size() <= Capacity().
    ABSL_DCHECK_LE(size(), allocated_size());
    ABSL_DCHECK_LE(allocated_size(), Capacity());
    // This is equivalent to `current_size_ == Capacity()`.
    // Assuming `Capacity()` function is inlined, compiler is likely to optimize
    // away "+ kSSOCapacity" and reduce it to "current_size_ > capacity_proxy_"
    // which is an instruction less than "current_size_ == capacity_proxy_ + 1".
    return current_size_ >= Capacity();
  }